

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_lifetime_analyzer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnLifetimeAnalyzer::VisitOperator(ColumnLifetimeAnalyzer *this,LogicalOperator *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *pvVar1;
  LogicalOperatorType LVar2;
  bool bVar3;
  reference pvVar4;
  pointer pLVar5;
  type op_00;
  LogicalOrder *pLVar6;
  LogicalFilter *pLVar7;
  uint uVar8;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *this_00;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_130;
  column_binding_set_t lhs_unused;
  __node_base_ptr p_Stack_c8;
  column_binding_set_t rhs_unused;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_88;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_70;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_58;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_40;
  idx_t has_range;
  
  bVar3 = TopN::CanOptimize(op);
  if (bVar3) {
    pvVar1 = &op->children;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(pvVar1,0);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar4);
    if (pLVar5->type == LOGICAL_ORDER_BY) {
      LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(pvVar1,0);
      op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*(pvVar4);
      LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op_00);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(pvVar1,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&pLVar5->children,0);
      op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar4);
      goto LAB_0125024b;
    }
  }
  LVar2 = op->type;
  uVar8 = LVar2 - 0x33;
  if (uVar8 < 0x34) {
    if ((0xe00001f000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
LAB_0124fdbc:
      lhs_unused._M_h._M_rehash_policy._0_8_ = &p_Stack_c8;
      lhs_unused._M_h._M_buckets = (__buckets_ptr)&PTR__ColumnLifetimeAnalyzer_02792e80;
      lhs_unused._M_h._M_bucket_count = (size_type)this->optimizer;
      lhs_unused._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this->root;
      lhs_unused._M_h._M_element_count = CONCAT71(lhs_unused._M_h._M_element_count._1_7_,1);
      lhs_unused._M_h._M_rehash_policy._M_next_resize = 1;
      lhs_unused._M_h._M_single_bucket = (__node_base_ptr)0x0;
      p_Stack_c8 = (__node_base_ptr)0x0;
      StandardVisitOperator((ColumnLifetimeAnalyzer *)&lhs_unused,op);
      goto LAB_0124fe08;
    }
    if ((0x23UL >> ((ulong)uVar8 & 0x3f) & 1) == 0) goto code_r0x0124ffd7;
    if (this->everything_referenced == false) {
      has_range = 0;
      bVar3 = LogicalComparisonJoin::HasEquality((LogicalComparisonJoin *)op,&has_range);
      if (!bVar3) {
        return;
      }
      if ((this->optimizer->context->config).prefer_range_joins != false) {
        return;
      }
      lhs_unused._M_h._M_buckets = &lhs_unused._M_h._M_single_bucket;
      lhs_unused._M_h._M_bucket_count = 1;
      lhs_unused._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      lhs_unused._M_h._M_element_count = 0;
      lhs_unused._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      lhs_unused._M_h._M_rehash_policy._M_next_resize = 0;
      lhs_unused._M_h._M_single_bucket = (__node_base_ptr)0x0;
      rhs_unused._M_h._M_buckets = &rhs_unused._M_h._M_single_bucket;
      rhs_unused._M_h._M_bucket_count = 1;
      rhs_unused._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      rhs_unused._M_h._M_element_count = 0;
      rhs_unused._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      rhs_unused._M_h._M_rehash_policy._M_next_resize = 0;
      rhs_unused._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pvVar1 = &op->children;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(pvVar1,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&local_130,pLVar5);
      ExtractUnusedColumnBindings
                (this,(vector<duckdb::ColumnBinding,_true> *)&local_130,&lhs_unused);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base(&local_130);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(pvVar1,1);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&local_130,pLVar5);
      ExtractUnusedColumnBindings
                (this,(vector<duckdb::ColumnBinding,_true> *)&local_130,&rhs_unused);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base(&local_130);
      StandardVisitOperator(this,op);
      if (op->type != LOGICAL_ASOF_JOIN) {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::get<true>(pvVar1,0);
        pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(pvVar4);
        (*pLVar5->_vptr_LogicalOperator[2])(&local_40,pLVar5);
        GenerateProjectionMap
                  ((vector<duckdb::ColumnBinding,_true> *)&local_40,&lhs_unused,
                   (vector<unsigned_long,_true> *)&op[1].type);
        ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
        ~_Vector_base(&local_40);
      }
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(pvVar1,1);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&local_58,pLVar5);
      GenerateProjectionMap
                ((vector<duckdb::ColumnBinding,_true> *)&local_58,&rhs_unused,
                 (vector<unsigned_long,_true> *)
                 &op[1].children.
                  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base(&local_58);
      ::std::
      _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&rhs_unused._M_h);
      goto LAB_01250231;
    }
    goto switchD_0124ffe5_caseD_4;
  }
code_r0x0124ffd7:
  switch(LVar2) {
  case LOGICAL_PROJECTION:
    lhs_unused._M_h._M_rehash_policy._0_8_ = &p_Stack_c8;
    lhs_unused._M_h._M_buckets = (__buckets_ptr)&PTR__ColumnLifetimeAnalyzer_02792e80;
    lhs_unused._M_h._M_bucket_count = (size_type)this->optimizer;
    lhs_unused._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this->root;
    lhs_unused._M_h._M_element_count = (ulong)lhs_unused._M_h._M_element_count._1_7_ << 8;
    lhs_unused._M_h._M_rehash_policy._M_next_resize = 1;
    lhs_unused._M_h._M_single_bucket = (__node_base_ptr)0x0;
    p_Stack_c8 = (__node_base_ptr)0x0;
    StandardVisitOperator((ColumnLifetimeAnalyzer *)&lhs_unused,op);
    goto LAB_0124fe08;
  case LOGICAL_FILTER:
    pLVar7 = LogicalOperator::Cast<duckdb::LogicalFilter>(op);
    if (this->everything_referenced == false) {
      lhs_unused._M_h._M_buckets = &lhs_unused._M_h._M_single_bucket;
      lhs_unused._M_h._M_bucket_count = 1;
      lhs_unused._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      lhs_unused._M_h._M_element_count = 0;
      lhs_unused._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      lhs_unused._M_h._M_rehash_policy._M_next_resize = 0;
      lhs_unused._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&op->children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&rhs_unused,pLVar5);
      ExtractUnusedColumnBindings
                (this,(vector<duckdb::ColumnBinding,_true> *)&rhs_unused,&lhs_unused);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &rhs_unused);
      StandardVisitOperator(this,op);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&op->children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&local_88,pLVar5);
      GenerateProjectionMap
                ((vector<duckdb::ColumnBinding,_true> *)&local_88,&lhs_unused,
                 &pLVar7->projection_map);
      this_00 = &local_88;
LAB_0125022c:
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base(this_00);
LAB_01250231:
      ::std::
      _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&lhs_unused._M_h);
      return;
    }
    break;
  case LOGICAL_AGGREGATE_AND_GROUP_BY:
    lhs_unused._M_h._M_rehash_policy._0_8_ = &p_Stack_c8;
    lhs_unused._M_h._M_buckets = (__buckets_ptr)&PTR__ColumnLifetimeAnalyzer_02792e80;
    lhs_unused._M_h._M_bucket_count = (size_type)this->optimizer;
    lhs_unused._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this->root;
    lhs_unused._M_h._M_element_count = (ulong)lhs_unused._M_h._M_element_count._1_7_ << 8;
    lhs_unused._M_h._M_rehash_policy._M_next_resize = 1;
    lhs_unused._M_h._M_single_bucket = (__node_base_ptr)0x0;
    p_Stack_c8 = (__node_base_ptr)0x0;
    StandardVisitOperator((ColumnLifetimeAnalyzer *)&lhs_unused,op);
LAB_0124fe08:
    ~ColumnLifetimeAnalyzer((ColumnLifetimeAnalyzer *)&lhs_unused);
    return;
  case LOGICAL_WINDOW:
  case LOGICAL_UNNEST:
  case LOGICAL_LIMIT:
  case LOGICAL_TOP_N:
  case LOGICAL_TOP_N|LOGICAL_PROJECTION:
  case LOGICAL_COPY_TO_FILE:
    break;
  case LOGICAL_ORDER_BY:
    pLVar6 = LogicalOperator::Cast<duckdb::LogicalOrder>(op);
    if (this->everything_referenced == false) {
      lhs_unused._M_h._M_buckets = &lhs_unused._M_h._M_single_bucket;
      lhs_unused._M_h._M_bucket_count = 1;
      lhs_unused._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      lhs_unused._M_h._M_element_count = 0;
      lhs_unused._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      lhs_unused._M_h._M_rehash_policy._M_next_resize = 0;
      lhs_unused._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&op->children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&rhs_unused,pLVar5);
      ExtractUnusedColumnBindings
                (this,(vector<duckdb::ColumnBinding,_true> *)&rhs_unused,&lhs_unused);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &rhs_unused);
      StandardVisitOperator(this,op);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&op->children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&local_70,pLVar5);
      GenerateProjectionMap
                ((vector<duckdb::ColumnBinding,_true> *)&local_70,&lhs_unused,
                 &pLVar6->projection_map);
      this_00 = &local_70;
      goto LAB_0125022c;
    }
    break;
  case LOGICAL_DISTINCT:
    this->everything_referenced = true;
    break;
  default:
    if (LVar2 == LOGICAL_GET) goto LAB_0124fdbc;
  }
switchD_0124ffe5_caseD_4:
LAB_0125024b:
  StandardVisitOperator(this,op);
  return;
}

Assistant:

void ColumnLifetimeAnalyzer::VisitOperator(LogicalOperator &op) {
	Verify(op);
	if (TopN::CanOptimize(op) && op.children[0]->type == LogicalOperatorType::LOGICAL_ORDER_BY) {
		// Let's not mess with this, TopN is more important than projection maps
		// TopN does not support a projection map like Order does
		VisitOperatorExpressions(op);                        // Visit LIMIT
		VisitOperatorExpressions(*op.children[0]);           // Visit ORDER
		StandardVisitOperator(*op.children[0]->children[0]); // Recurse into child of ORDER
		return;
	}
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY: {
		// FIXME: groups that are not referenced can be removed from projection
		// recurse into the children of the aggregate
		ColumnLifetimeAnalyzer analyzer(optimizer, root);
		analyzer.StandardVisitOperator(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN: {
		auto &comp_join = op.Cast<LogicalComparisonJoin>();
		if (everything_referenced) {
			break;
		}

		// FIXME: for now, we only push into the projection map for equality (hash) joins
		idx_t has_range = 0;
		if (!comp_join.HasEquality(has_range) || optimizer.context.config.prefer_range_joins) {
			return;
		}

		column_binding_set_t lhs_unused;
		column_binding_set_t rhs_unused;
		ExtractUnusedColumnBindings(op.children[0]->GetColumnBindings(), lhs_unused);
		ExtractUnusedColumnBindings(op.children[1]->GetColumnBindings(), rhs_unused);

		StandardVisitOperator(op);

		// then generate the projection map
		if (op.type != LogicalOperatorType::LOGICAL_ASOF_JOIN) {
			// FIXME: left_projection_map in ASOF join
			GenerateProjectionMap(op.children[0]->GetColumnBindings(), lhs_unused, comp_join.left_projection_map);
		}
		GenerateProjectionMap(op.children[1]->GetColumnBindings(), rhs_unused, comp_join.right_projection_map);
		return;
	}
	case LogicalOperatorType::LOGICAL_INSERT:
	case LogicalOperatorType::LOGICAL_UPDATE:
	case LogicalOperatorType::LOGICAL_DELETE:
		//! When RETURNING is used, a PROJECTION is the top level operator for INSERTS, UPDATES, and DELETES
		//! We still need to project all values from these operators so the projection
		//! on top of them can select from only the table values being inserted.
	case LogicalOperatorType::LOGICAL_GET:
	case LogicalOperatorType::LOGICAL_UNION:
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE:
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE: {
		// for set operations/materialized CTEs we don't remove anything, just recursively visit the children
		// FIXME: for UNION we can remove unreferenced columns as long as everything_referenced is false (i.e. we
		// encounter a UNION node that is not preceded by a DISTINCT)
		ColumnLifetimeAnalyzer analyzer(optimizer, root, true);
		analyzer.StandardVisitOperator(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		// then recurse into the children of this projection
		ColumnLifetimeAnalyzer analyzer(optimizer, root);
		analyzer.StandardVisitOperator(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_ORDER_BY: {
		auto &order = op.Cast<LogicalOrder>();
		if (everything_referenced) {
			break;
		}

		column_binding_set_t unused_bindings;
		ExtractUnusedColumnBindings(op.children[0]->GetColumnBindings(), unused_bindings);

		StandardVisitOperator(op);

		GenerateProjectionMap(op.children[0]->GetColumnBindings(), unused_bindings, order.projection_map);
		return;
	}
	case LogicalOperatorType::LOGICAL_DISTINCT: {
		// distinct, all projected columns are used for the DISTINCT computation
		// mark all columns as used and continue to the children
		// FIXME: DISTINCT with expression list does not implicitly reference everything
		everything_referenced = true;
		break;
	}
	case LogicalOperatorType::LOGICAL_FILTER: {
		auto &filter = op.Cast<LogicalFilter>();
		if (everything_referenced) {
			break;
		}

		// filter, figure out which columns are not needed after the filter
		column_binding_set_t unused_bindings;
		ExtractUnusedColumnBindings(op.children[0]->GetColumnBindings(), unused_bindings);

		StandardVisitOperator(op);

		// then generate the projection map
		GenerateProjectionMap(op.children[0]->GetColumnBindings(), unused_bindings, filter.projection_map);

		return;
	}
	default:
		break;
	}
	StandardVisitOperator(op);
}